

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int buffer_insert(BUFFER *buf,size_t off,void *data,size_t n)

{
  int iVar1;
  void *__dest;
  
  __dest = buffer_insert_raw(buf,off,n);
  if (__dest == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    memcpy(__dest,data,n);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
buffer_insert(BUFFER* buf, size_t off, const void* data, size_t n)
{
    void* ptr;

    ptr = buffer_insert_raw(buf, off, n);
    if(ptr == NULL)
        return -1;

    memcpy(ptr, data, n);
    return 0;
}